

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

Vec_Wec_t * Cmd_ReadParamChoices(char *pConfig)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Wec_t *pVVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  double dVar13;
  char pBuffer [1000];
  Vec_Int_t *local_448;
  undefined8 local_420;
  byte local_418 [1000];
  
  __stream = fopen(pConfig,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar6 = "File containing list of files \"%s\" cannot be opened.\n";
LAB_0032498a:
    pVVar5 = (Vec_Wec_t *)0x0;
    printf(pcVar6,pConfig);
  }
  else {
    pVVar5 = (Vec_Wec_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    local_448 = (Vec_Int_t *)calloc(100,0x10);
    pVVar5->pArray = local_448;
    pcVar6 = fgets((char *)local_418,1000,__stream);
    if (pcVar6 != (char *)0x0) {
      uVar10 = 0;
      uVar4 = 100;
      local_420 = pVVar5;
      do {
        if ((0x23 < (ulong)local_418[0]) ||
           ((0x900002600U >> ((ulong)local_418[0] & 0x3f) & 1) == 0)) {
          while( true ) {
            sVar7 = strlen((char *)local_418);
            uVar8 = (ulong)local_418[sVar7 - 1];
            if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
            local_418[sVar7 - 1] = 0;
          }
          uVar11 = uVar4;
          if (uVar10 == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (local_448 == (Vec_Int_t *)0x0) {
                local_448 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                local_448 = (Vec_Int_t *)realloc(local_448,0x100);
              }
              pVVar5->pArray = local_448;
              pVVar9 = local_448 + (int)uVar4;
              uVar11 = 0x10;
              uVar4 = 0x10 - uVar4;
            }
            else {
              uVar11 = uVar4 * 2;
              if (local_448 == (Vec_Int_t *)0x0) {
                local_448 = (Vec_Int_t *)malloc((ulong)uVar11 << 4);
              }
              else {
                local_448 = (Vec_Int_t *)realloc(local_448,(ulong)uVar11 << 4);
              }
              pVVar5->pArray = local_448;
              pVVar9 = local_448 + uVar4;
            }
            memset(pVVar9,0,(ulong)uVar4 << 4);
            pVVar5->nCap = uVar11;
          }
          uVar1 = uVar10 + 1;
          pVVar5->nSize = uVar1;
          if ((int)uVar10 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          uVar8 = (ulong)local_418[0];
          uVar10 = uVar1;
          uVar4 = uVar11;
          if (local_418[0] != 0) {
            pVVar9 = local_448 + ((ulong)uVar1 - 1);
            pbVar12 = local_418;
LAB_00324886:
            do {
              if ((byte)((char)uVar8 + 0x85U) < 0xe6) {
                if ((byte)((char)uVar8 + 0xa5U) < 0xe6) {
                  pcVar6 = "Expecting a leading lower-case or upper-case digit in line \"%s\".\n";
                  pConfig = (char *)local_418;
                  goto LAB_0032498a;
                }
                if (pbVar12[1] != 0x2e && (byte)(pbVar12[1] - 0x3a) < 0xf6) {
                  printf("Upper-case character (%c) should be followed by a number without space in line \"%s\".\n"
                         ,uVar8,local_418);
                  return (Vec_Wec_t *)0x0;
                }
                dVar13 = atof((char *)(pbVar12 + 1));
                Vec_IntPush(pVVar9,(int)uVar8);
                Vec_IntPush(pVVar9,(int)(float)dVar13);
                do {
                  bVar3 = pbVar12[1];
                  pbVar12 = pbVar12 + 1;
                } while (bVar3 == 0x2e || 0xf5 < (byte)(bVar3 - 0x3a));
                while (uVar8 = (ulong)bVar3, pVVar5 = local_420, bVar3 < 0x21) {
                  if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) goto joined_r0x00324964;
                  pbVar2 = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                  bVar3 = *pbVar2;
                }
                goto LAB_00324886;
              }
              Vec_IntPush(pVVar9,(int)uVar8);
              Vec_IntPush(pVVar9,-0x40800000);
              do {
                pbVar12 = pbVar12 + 1;
                uVar8 = (ulong)*pbVar12;
                if (0x20 < uVar8) goto LAB_00324886;
              } while ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0);
joined_r0x00324964:
            } while (uVar8 != 0);
          }
        }
        pcVar6 = fgets((char *)local_418,1000,__stream);
      } while (pcVar6 != (char *)0x0);
    }
    fclose(__stream);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Cmd_ReadParamChoices( char * pConfig )
{
    Vec_Wec_t * vPars;
    Vec_Int_t * vLine;
    char * pThis, pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pConfig, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pConfig ); return NULL; }
    vPars = Vec_WecAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the line
        vLine = Vec_WecPushLevel( vPars );
        for ( pThis = pBuffer; *pThis;  )
        {
            if ( Cmf_IsLowerCaseChar(*pThis) )
            {
                Vec_IntPushTwo( vLine, (int)*pThis, Abc_Float2Int((float)-1.0) );
                pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            if ( Cmf_IsUpperCaseChar(*pThis) )
            {
                char Param = *pThis++;
                if ( !Cmf_IsDigit(*pThis) )
                    { printf( "Upper-case character (%c) should be followed by a number without space in line \"%s\".\n", Param, pBuffer ); return NULL; }
                Vec_IntPushTwo( vLine, (int)Param, Abc_Float2Int(atof(pThis)) );
                while ( Cmf_IsDigit(*pThis) )
                    pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            printf( "Expecting a leading lower-case or upper-case digit in line \"%s\".\n", pBuffer ); 
            return NULL;
        }
    }
    fclose( pFile );
    return vPars;
}